

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LodRenderer.cpp
# Opt level: O3

void __thiscall
LodRenderer::removeDecoration(LodRenderer *this,repr coords,uint tileIndex,Drawable *drawable)

{
  pointer ppVar1;
  iterator __position;
  iterator iVar2;
  Drawable **ppDVar3;
  long lVar4;
  ulong uVar5;
  pointer ppVar6;
  uint local_34;
  repr local_30;
  
  local_34 = tileIndex;
  local_30 = coords;
  __position = FlatMap<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>,_std::less<unsigned_long>_>
               ::find(&this->decorations_,&local_30);
  iVar2 = FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>::find
                    (&(__position._M_current)->second,&local_34);
  if ((iVar2._M_current)->second == drawable) {
    ppVar6 = ((__position._M_current)->second).vec_.
             super__Vector_base<std::pair<unsigned_int,_const_sf::Drawable_*>,_std::allocator<std::pair<unsigned_int,_const_sf::Drawable_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar1 = ((__position._M_current)->second).vec_.
             super__Vector_base<std::pair<unsigned_int,_const_sf::Drawable_*>,_std::allocator<std::pair<unsigned_int,_const_sf::Drawable_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((iVar2._M_current + 1 != ppVar1) &&
       (lVar4 = (long)ppVar1 - (long)(iVar2._M_current + 1) >> 4, 0 < lVar4)) {
      uVar5 = lVar4 + 1;
      ppDVar3 = &iVar2._M_current[1].second;
      do {
        *(uint *)(ppDVar3 + -3) =
             ((pair<unsigned_int,_const_sf::Drawable_*> *)(ppDVar3 + -1))->first;
        ppDVar3[-2] = *ppDVar3;
        uVar5 = uVar5 - 1;
        ppDVar3 = ppDVar3 + 2;
      } while (1 < uVar5);
      ppVar6 = ((__position._M_current)->second).vec_.
               super__Vector_base<std::pair<unsigned_int,_const_sf::Drawable_*>,_std::allocator<std::pair<unsigned_int,_const_sf::Drawable_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    ((__position._M_current)->second).vec_.
    super__Vector_base<std::pair<unsigned_int,_const_sf::Drawable_*>,_std::allocator<std::pair<unsigned_int,_const_sf::Drawable_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar1 + -1;
    if (ppVar6 == ppVar1 + -1) {
      std::
      vector<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>_>_>
      ::_M_erase(&(this->decorations_).vec_,(iterator)__position._M_current);
    }
  }
  return;
}

Assistant:

void LodRenderer::removeDecoration(ChunkCoords::repr coords, unsigned int tileIndex, const sf::Drawable* drawable) {
    auto chunkDeco = decorations_.find(coords);
    auto deco = chunkDeco->second.find(tileIndex);
    if (deco->second != drawable) {
        // Do nothing if there is a different drawable at the selected coordinates.
        return;
    }
    chunkDeco->second.erase(deco);
    if (chunkDeco->second.empty()) {
        decorations_.erase(chunkDeco);
    }
}